

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  undefined8 uVar1;
  HavingToWhereCtx *pHVar2;
  sqlite3 *db;
  Expr *pLeft;
  char cVar3;
  undefined2 uVar4;
  u32 uVar5;
  Expr *pRight;
  Expr *pEVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  Expr *pEVar11;
  Expr *pEVar12;
  Expr *pEVar13;
  Expr *pEVar14;
  byte bVar15;
  Expr t;
  
  bVar15 = 0;
  pEVar6 = &t;
  iVar10 = 0;
  if (pExpr->op != 'G') {
    t._0_8_ = pWalker->pParse;
    pHVar2 = (pWalker->u).pHavingCtx;
    t._40_8_ = pHVar2->pGroupBy;
    t.x._4_1_ = 1;
    t.u.zToken = (char *)exprNodeIsConstantOrGroupBy;
    t.pLeft = (Expr *)0x0;
    sqlite3WalkExpr((Walker *)&t,pExpr);
    iVar10 = 1;
    if (t.x._4_1_ != '\0') {
      db = pWalker->pParse->db;
      pRight = sqlite3ExprAlloc(db,0x86,sqlite3IntTokens + 1,0);
      if (pRight != (Expr *)0x0) {
        pLeft = *pHVar2->ppWhere;
        lVar9 = 9;
        pEVar11 = pRight;
        pEVar13 = &t;
        for (lVar7 = lVar9; lVar8 = lVar9, pEVar12 = pExpr, pEVar14 = pRight, lVar7 != 0;
            lVar7 = lVar7 + -1) {
          *(undefined8 *)pEVar13 = *(undefined8 *)pEVar11;
          pEVar11 = (Expr *)((long)pEVar11 + (ulong)bVar15 * -0x10 + 8);
          pEVar13 = (Expr *)((long)pEVar13 + ((ulong)bVar15 * -2 + 1) * 8);
        }
        for (; lVar8 != 0; lVar8 = lVar8 + -1) {
          cVar3 = pEVar12->affinity;
          uVar4 = *(undefined2 *)&pEVar12->field_0x2;
          uVar5 = pEVar12->flags;
          pEVar14->op = pEVar12->op;
          pEVar14->affinity = cVar3;
          *(undefined2 *)&pEVar14->field_0x2 = uVar4;
          pEVar14->flags = uVar5;
          pEVar12 = (Expr *)((long)pEVar12 + (ulong)bVar15 * -0x10 + 8);
          pEVar14 = (Expr *)((long)pEVar14 + (ulong)bVar15 * -0x10 + 8);
        }
        for (; lVar9 != 0; lVar9 = lVar9 + -1) {
          uVar1 = *(undefined8 *)pEVar6;
          pExpr->op = (char)uVar1;
          pExpr->affinity = (char)((ulong)uVar1 >> 8);
          *(short *)&pExpr->field_0x2 = (short)((ulong)uVar1 >> 0x10);
          pExpr->flags = (int)((ulong)uVar1 >> 0x20);
          pEVar6 = (Expr *)((long)pEVar6 + ((ulong)bVar15 * -2 + 1) * 8);
          pExpr = (Expr *)((long)pExpr + (ulong)bVar15 * -0x10 + 8);
        }
        pEVar6 = sqlite3ExprAnd(db,pLeft,pRight);
        *pHVar2->ppWhere = pEVar6;
      }
    }
  }
  return iVar10;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    struct HavingToWhereCtx *p = pWalker->u.pHavingCtx;
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, p->pGroupBy) ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[1], 0);
      if( pNew ){
        Expr *pWhere = *(p->ppWhere);
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(db, pWhere, pNew);
        *(p->ppWhere) = pNew;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}